

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

int __thiscall
QTableViewPrivate::heightHintForIndex
          (QTableViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option)

{
  bool bVar1;
  int iVar2;
  Span *pSVar3;
  QTableViewPrivate *this_00;
  Span *pSVar4;
  long *plVar5;
  int *piVar6;
  long in_RCX;
  int in_EDX;
  QModelIndex *in_RSI;
  QTableViewPrivate *in_RDI;
  long in_FS_OFFSET;
  Span *span;
  int height;
  QTableView *q;
  int max;
  int min;
  QWidget *editor;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int *in_stack_ffffffffffffff08;
  QWidget *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int iVar7;
  undefined4 in_stack_ffffffffffffff1c;
  Span *span_00;
  int local_58;
  QRect local_54;
  int local_44;
  int local_40;
  QSize local_3c;
  int local_34;
  QSize local_30;
  int local_28;
  undefined8 local_24;
  int local_1c;
  QWidget *local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  pSVar3 = (Span *)q_func(in_RDI);
  QAbstractItemViewPrivate::editorForIndex
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (QModelIndex *)in_stack_ffffffffffffff10);
  local_18 = QPointer<QWidget>::data((QPointer<QWidget> *)0x8b526f);
  if ((local_18 != (QWidget *)0x0) &&
     (bVar1 = QSet<QWidget_*>::contains
                        ((QSet<QWidget_*> *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (QWidget **)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
     bVar1)) {
    local_24 = (**(code **)(*(long *)local_18 + 0x70))();
    local_1c = QSize::height((QSize *)0x8b52cb);
    piVar6 = qMax<int>(&local_c,&local_1c);
    local_c = *piVar6;
    local_30 = QWidget::minimumSize(in_stack_ffffffffffffff10);
    local_28 = QSize::height((QSize *)0x8b5312);
    local_3c = QWidget::maximumSize(in_stack_ffffffffffffff10);
    local_34 = QSize::height((QSize *)0x8b533b);
    piVar6 = qBound<int>((int *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    local_c = *piVar6;
  }
  if (((in_RDI->super_QAbstractItemViewPrivate).wrapItemText & 1U) != 0) {
    QModelIndex::row(in_RSI);
    QTableView::rowViewportPosition
              ((QTableView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc);
    QRect::setY((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                in_stack_fffffffffffffefc);
    QModelIndex::row(in_RSI);
    QTableView::rowHeight
              ((QTableView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc);
    QRect::setHeight((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
    QModelIndex::column(in_RSI);
    QTableView::columnViewportPosition
              ((QTableView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc);
    QRect::setX((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                in_stack_fffffffffffffefc);
    this_00 = (QTableViewPrivate *)(in_RCX + 0x10);
    span_00 = pSVar3;
    QModelIndex::column(in_RSI);
    QTableView::columnWidth
              ((QTableView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc);
    QRect::setWidth((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    in_stack_fffffffffffffefc);
    bVar1 = hasSpans((QTableViewPrivate *)0x8b54a7);
    if (bVar1) {
      QModelIndex::column(in_RSI);
      QModelIndex::row(in_RSI);
      pSVar4 = QSpanCollection::spanAt
                         ((QSpanCollection *)in_stack_ffffffffffffff10,
                          (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                          (int)in_stack_ffffffffffffff08);
      if (pSVar4 != (Span *)0x0) {
        iVar7 = pSVar4->m_left;
        iVar2 = QModelIndex::column(in_RSI);
        if (iVar7 == iVar2) {
          iVar7 = pSVar4->m_top;
          iVar2 = QModelIndex::row(in_RSI);
          if (iVar7 == iVar2) {
            local_40 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                      in_stack_fffffffffffffef8));
            local_54 = visualSpanRect(this_00,span_00);
            local_44 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                      in_stack_fffffffffffffef8));
            std::max<int>(&local_40,&local_44);
            QRect::setWidth((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                            in_stack_fffffffffffffefc);
          }
        }
      }
    }
    if ((in_RDI->showGrid & 1U) != 0) {
      QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QRect::setWidth((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffefc);
    }
  }
  plVar5 = (long *)(**(code **)(*(long *)pSVar3 + 0x208))(pSVar3,in_RSI);
  (**(code **)(*plVar5 + 0x68))(plVar5,in_RCX,in_RSI);
  local_58 = QSize::height((QSize *)0x8b5655);
  piVar6 = qMax<int>(&local_c,&local_58);
  local_c = *piVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

int QTableViewPrivate::heightHintForIndex(const QModelIndex &index, int hint, QStyleOptionViewItem &option) const
{
    Q_Q(const QTableView);
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().height());
        int min = editor->minimumSize().height();
        int max = editor->maximumSize().height();
        hint = qBound(min, hint, max);
    }

    if (wrapItemText) {// for wrapping boundaries
        option.rect.setY(q->rowViewportPosition(index.row()));
        int height = q->rowHeight(index.row());
        // if the option.height == 0 then q->itemDelegateForIndex(index)->sizeHint(option, index) will be wrong.
        // The option.height == 0 is used to conclude that the text is not wrapped, and hence it will
        // (exactly like widthHintForIndex) return a QSize with a long width (that we don't use) -
        // and the height of the text if it was/is on one line.
        // What we want is a height hint for the current width (and we know that this section is not hidden)
        // Therefore we catch this special situation with:
        if (height == 0)
            height = 1;
        option.rect.setHeight(height);
        option.rect.setX(q->columnViewportPosition(index.column()));
        option.rect.setWidth(q->columnWidth(index.column()));
        if (hasSpans()) {
            auto span = spans.spanAt(index.column(), index.row());
            if (span && span->m_left == index.column() && span->m_top == index.row())
                option.rect.setWidth(std::max(option.rect.width(), visualSpanRect(*span).width()));
        }
        // 1px less space when grid is shown (see drawCell)
        if (showGrid)
            option.rect.setWidth(option.rect.width() - 1);
    }
    hint = qMax(hint, q->itemDelegateForIndex(index)->sizeHint(option, index).height());
    return hint;
}